

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PushScope(cmMakefile *this)

{
  Internals *this_00;
  cmGlobalGenerator *this_01;
  cmFileLockPool *this_02;
  cmMakefile *this_local;
  
  this_00 = cmsys::auto_ptr<cmMakefile::Internals>::operator->(&this->Internal);
  Internals::PushDefinitions(this_00);
  PushLoopBlockBarrier(this);
  this_01 = GetGlobalGenerator(this);
  this_02 = cmGlobalGenerator::GetFileLockPool(this_01);
  cmFileLockPool::PushFunctionScope(this_02);
  return;
}

Assistant:

void cmMakefile::PushScope()
{
  this->Internal->PushDefinitions();

  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif
}